

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvarianceTestCase::createInstance
          (InvarianceTestCase *this,Context *context)

{
  int iVar1;
  Context *pCVar2;
  ulong uVar3;
  TestInstance *pTVar4;
  
  uVar3 = (ulong)(this->m_caseDef).caseType;
  if (uVar3 < 4) {
    iVar1 = *(int *)(&DAT_00b47cec + uVar3 * 4);
    pTVar4 = (TestInstance *)operator_new(0x28);
    pTVar4->m_context = context;
    pTVar4->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00d2efd8;
    pCVar2 = *(Context **)&(this->m_caseDef).spacingMode;
    pTVar4[1]._vptr_TestInstance = *(_func_int ***)&this->m_caseDef;
    pTVar4[1].m_context = pCVar2;
    *(undefined4 *)&pTVar4[2]._vptr_TestInstance = *(undefined4 *)&(this->m_caseDef).usePointMode;
    pTVar4->_vptr_TestInstance = (_func_int **)(&DAT_00b47cec + iVar1);
    return pTVar4;
  }
  return (TestInstance *)0x0;
}

Assistant:

TestInstance* InvarianceTestCase::createInstance (Context& context) const
{
	switch (m_caseDef.caseType)
	{
		case CASETYPE_INVARIANT_PRIMITIVE_SET:			return new InvariantPrimitiveSetTestInstance    (context, m_caseDef);
		case CASETYPE_INVARIANT_TRIANGLE_SET:			return new InvariantTriangleSetTestInstance     (context, m_caseDef);
		case CASETYPE_INVARIANT_OUTER_TRIANGLE_SET:		return new InvariantOuterTriangleSetTestInstance(context, m_caseDef);
		case CASETYPE_INVARIANT_INNER_TRIANGLE_SET:		return new InvariantInnerTriangleSetTestInstance(context, m_caseDef);
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}